

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::CopyPropagateArrays::MemoryObject::GetNumberOfMembers(MemoryObject *this)

{
  uint32_t uVar1;
  int iVar2;
  IRContext *this_00;
  TypeManager *this_01;
  undefined4 extraout_var;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> access_indices;
  Type *type;
  TypeManager *type_mgr;
  IRContext *context;
  MemoryObject *this_local;
  
  this_00 = Instruction::context(this->variable_inst_);
  this_01 = IRContext::get_type_mgr(this_00);
  uVar1 = Instruction::type_id(this->variable_inst_);
  access_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)analysis::TypeManager::GetType(this_01,uVar1)
  ;
  iVar2 = (*((Type *)access_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_Type[0x20])();
  access_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)analysis::Pointer::pointee_type((Pointer *)CONCAT44(extraout_var,iVar2));
  GetAccessIds((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,this);
  access_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)analysis::TypeManager::GetMemberType
                          (this_01,(Type *)access_indices.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  uVar1 = anon_unknown_0::GetNumberOfMembers
                    ((Type *)access_indices.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
  return uVar1;
}

Assistant:

uint32_t CopyPropagateArrays::MemoryObject::GetNumberOfMembers() {
  IRContext* context = variable_inst_->context();
  analysis::TypeManager* type_mgr = context->get_type_mgr();

  const analysis::Type* type = type_mgr->GetType(variable_inst_->type_id());
  type = type->AsPointer()->pointee_type();

  std::vector<uint32_t> access_indices = GetAccessIds();
  type = type_mgr->GetMemberType(type, access_indices);

  return opt::GetNumberOfMembers(type, context);
}